

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_helpers.h
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* winmd::reader::get_type_namespace_and_name
            (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             *__return_storage_ptr__,coded_index<winmd::reader::TypeDefOrRef> *type)

{
  uint uVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  TypeDef local_30;
  
  uVar1 = (type->super_typed_index<winmd::reader::TypeDefOrRef>).
          super_index_base<winmd::reader::TypeDefOrRef>.m_value;
  if ((uVar1 & 3) == 1) {
    local_30.super_row_base<winmd::reader::TypeDef>.m_table =
         (table_base *)
         ((type->super_typed_index<winmd::reader::TypeDefOrRef>).
          super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database;
    local_30.super_row_base<winmd::reader::TypeDef>.m_index = (uVar1 >> 2) - 1;
    bVar2 = TypeRef::TypeNamespace((TypeRef *)&local_30);
    bVar3 = TypeRef::TypeName((TypeRef *)&local_30);
  }
  else {
    if ((uVar1 & 3) != 0) {
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char *)0x0;
      (__return_storage_ptr__->first)._M_len = 0;
      (__return_storage_ptr__->first)._M_str = (char *)0x0;
      return __return_storage_ptr__;
    }
    local_30.super_row_base<winmd::reader::TypeDef>.m_table =
         &(((type->super_typed_index<winmd::reader::TypeDefOrRef>).
            super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database->TypeDef).
          super_table_base;
    local_30.super_row_base<winmd::reader::TypeDef>.m_index = (uVar1 >> 2) - 1;
    bVar2 = TypeDef::TypeNamespace(&local_30);
    bVar3 = TypeDef::TypeName(&local_30);
  }
  __return_storage_ptr__->first = bVar2;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string_view, std::string_view> get_type_namespace_and_name(coded_index<TypeDefOrRef> const& type)
    {
        if (type.type() == TypeDefOrRef::TypeDef)
        {
            auto const def = type.TypeDef();
            return { def.TypeNamespace(), def.TypeName() };
        }
        else if (type.type() == TypeDefOrRef::TypeRef)
        {
            auto const ref = type.TypeRef();
            return { ref.TypeNamespace(), ref.TypeName() };
        }
        else
        {
            XLANG_ASSERT(false);
            return {};
        }
    }